

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O1

QAccessibleInterface * __thiscall QAccessibleTable::childAt(QAccessibleTable *this,int x,int y)

{
  QAccessibleObject *pQVar1;
  int iVar2;
  Representation RVar3;
  uint uVar4;
  int iVar5;
  QAbstractScrollArea *this_00;
  QWidget *pQVar6;
  QWidget *parent;
  QPoint QVar7;
  long *plVar8;
  QListView *this_01;
  QHeaderView *pQVar9;
  QHeaderView *pQVar10;
  QAccessibleInterface *pQVar11;
  Representation RVar12;
  long in_FS_OFFSET;
  bool bVar13;
  QPoint indexPosition;
  QPoint local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->super_QAccessibleObject;
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(pQVar1);
  this_00 = (QAbstractScrollArea *)
            QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  pQVar6 = QAbstractScrollArea::viewport(this_00);
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(pQVar1);
  parent = (QWidget *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  local_58.xp.m_i = 0;
  local_58.yp.m_i = 0;
  QVar7 = QWidget::mapTo(pQVar6,parent,&local_58);
  local_40 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(pQVar1);
  pQVar6 = (QWidget *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  local_58.xp.m_i = x - QVar7.xp.m_i;
  local_58.yp.m_i = y - QVar7.yp.m_i;
  local_40 = QWidget::mapFromGlobal(pQVar6,&local_58);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.xp.m_i = 0xaaaaaaaa;
  local_58.yp.m_i = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(pQVar1);
  plVar8 = (long *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  (**(code **)(*plVar8 + 0x1f0))(&local_58,plVar8,&local_40);
  RVar3.m_i = local_58.yp.m_i;
  pQVar11 = (QAccessibleInterface *)0x0;
  bVar13 = -1 < (local_58.xp.m_i | local_58.yp.m_i);
  if ((bVar13) && (local_48 != (undefined1 *)0x0)) {
    RVar12.m_i = 0xffffffff;
    if (bVar13 && local_48 != (undefined1 *)0x0) {
      if (this->m_role == List) {
        (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
        QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
        this_01 = (QListView *)QMetaObject::cast((QObject *)&QListView::staticMetaObject);
        uVar4 = QListView::modelColumn(this_01);
        RVar12.m_i = 0xffffffff;
        if (RVar3.m_i == uVar4) {
          RVar12.m_i = local_58.xp.m_i;
        }
      }
      else {
        pQVar9 = verticalHeader(this);
        pQVar10 = horizontalHeader(this);
        iVar2 = local_58.xp.m_i + 1;
        iVar5 = (**(code **)(*(long *)this + 0x58))(this);
        RVar12.m_i = (uint)(pQVar9 != (QHeaderView *)0x0) + local_58.yp.m_i +
                     (iVar5 + (uint)(pQVar9 != (QHeaderView *)0x0)) *
                     (iVar2 - (uint)(pQVar10 == (QHeaderView *)0x0));
      }
    }
    pQVar11 = (QAccessibleInterface *)(**(code **)(*(long *)this + 0x100))(this,RVar12.m_i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar11;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleTable::childAt(int x, int y) const
{
    QPoint viewportOffset = view()->viewport()->mapTo(view(), QPoint(0,0));
    QPoint indexPosition = view()->mapFromGlobal(QPoint(x, y) - viewportOffset);
    // FIXME: if indexPosition < 0 in one coordinate, return header

    const QModelIndex index = view()->indexAt(indexPosition);
    if (index.isValid())
        return child(logicalIndex(index));
    return nullptr;
}